

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,unsigned_int,int>
          (ResultBuilder *this,uint *lhs,int *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  RelationalComparator<0,_unsigned_int,_int> *in_RDI;
  int *in_stack_00000028;
  char *in_stack_00000030;
  uint *in_stack_00000038;
  uint *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  
  bVar1 = RelationalComparator<0,_unsigned_int,_int>::operator()
                    (in_RDI,in_stack_ffffffffffffffa8,(int *)0x16f7d1);
  in_RDI[0x28] = (RelationalComparator<0,_unsigned_int,_int>)((bVar1 ^ 0xffU) & 1);
  if ((((byte)in_RDI[0x28] & 1) == 0) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)
     ) {
    return;
  }
  stringifyBinaryExpr<unsigned_int,int>(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  String::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  String::~String(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }